

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O0

REF_STATUS
ref_gather_node_tec_block
          (REF_NODE ref_node,REF_GLOB nnode,REF_GLOB *l2c,REF_INT ldim,REF_DBL *scalar,
          int dataformat,FILE *file)

{
  size_t sVar1;
  size_t sVar2;
  int local_110;
  int local_104;
  int local_100;
  int local_fc;
  int local_f4;
  REF_LONG ref_private_status_reis_bi_2;
  REF_LONG ref_private_status_reis_ai_2;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  float single_float;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rxs;
  REF_STATUS ref_private_macro_code_rss;
  REF_GLOB *sorted_cellnode;
  REF_INT position;
  REF_INT total_cellnode;
  REF_INT *pack;
  REF_INT *sorted_local;
  int local_88;
  REF_STATUS status;
  REF_INT ivar;
  REF_INT i;
  REF_INT n;
  REF_INT local;
  REF_GLOB global;
  REF_GLOB first;
  REF_GLOB nnode_written;
  REF_DBL *xyzm;
  REF_DBL *local_xyzm;
  REF_MPI pRStack_48;
  REF_INT chunk;
  REF_MPI ref_mpi;
  REF_DBL *pRStack_38;
  int dataformat_local;
  REF_DBL *scalar_local;
  REF_GLOB *pRStack_28;
  REF_INT ldim_local;
  REF_GLOB *l2c_local;
  REF_GLOB nnode_local;
  REF_NODE ref_node_local;
  
  pRStack_48 = ref_node->ref_mpi;
  sorted_cellnode._4_4_ = 0;
  for (status = 0; status < ref_node->max; status = status + 1) {
    if ((l2c[status] != -1) && (ref_node->ref_mpi->id == ref_node->part[status])) {
      sorted_cellnode._4_4_ = sorted_cellnode._4_4_ + 1;
    }
  }
  ref_mpi._4_4_ = dataformat;
  pRStack_38 = scalar;
  scalar_local._4_4_ = ldim;
  pRStack_28 = l2c;
  l2c_local = (REF_GLOB *)nnode;
  nnode_local = (REF_GLOB)ref_node;
  if (sorted_cellnode._4_4_ < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0xff,
           "ref_gather_node_tec_block","malloc sorted_local of REF_INT negative");
    ref_node_local._4_4_ = 1;
  }
  else {
    pack = (REF_INT *)malloc((long)sorted_cellnode._4_4_ << 2);
    if (pack == (REF_INT *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0xff
             ,"ref_gather_node_tec_block","malloc sorted_local of REF_INT NULL");
      ref_node_local._4_4_ = 2;
    }
    else if (sorted_cellnode._4_4_ < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x100,"ref_gather_node_tec_block","malloc sorted_cellnode of REF_GLOB negative");
      ref_node_local._4_4_ = 1;
    }
    else {
      _ref_private_macro_code_rxs = (REF_GLOB *)malloc((long)sorted_cellnode._4_4_ << 3);
      if (_ref_private_macro_code_rxs == (REF_GLOB *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x100,"ref_gather_node_tec_block","malloc sorted_cellnode of REF_GLOB NULL");
        ref_node_local._4_4_ = 2;
      }
      else if (sorted_cellnode._4_4_ < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x101,"ref_gather_node_tec_block","malloc pack of REF_INT negative");
        ref_node_local._4_4_ = 1;
      }
      else {
        _position = malloc((long)sorted_cellnode._4_4_ << 2);
        if (_position == (void *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x101,"ref_gather_node_tec_block","malloc pack of REF_INT NULL");
          ref_node_local._4_4_ = 2;
        }
        else {
          sorted_cellnode._4_4_ = 0;
          for (status = 0; status < *(int *)(nnode_local + 4); status = status + 1) {
            if ((pRStack_28[status] != -1) &&
               (*(int *)(*(long *)(nnode_local + 0x50) + 4) ==
                *(int *)(*(long *)(nnode_local + 0x28) + (long)status * 4))) {
              _ref_private_macro_code_rxs[sorted_cellnode._4_4_] = pRStack_28[status];
              *(REF_STATUS *)((long)_position + (long)sorted_cellnode._4_4_ * 4) = status;
              sorted_cellnode._4_4_ = sorted_cellnode._4_4_ + 1;
            }
          }
          ref_private_macro_code_rss_1 =
               ref_sort_heap_glob(sorted_cellnode._4_4_,_ref_private_macro_code_rxs,pack);
          if (ref_private_macro_code_rss_1 == 0) {
            for (status = 0; status < sorted_cellnode._4_4_; status = status + 1) {
              pack[status] = *(REF_INT *)((long)_position + (long)pack[status] * 4);
              _ref_private_macro_code_rxs[status] = pRStack_28[pack[status]];
            }
            if (_position != (void *)0x0) {
              free(_position);
            }
            local_f4 = (int)((long)l2c_local / (long)pRStack_48->n) + 1;
            if (local_f4 < 0x186a1) {
              local_f4 = 100000;
            }
            if (pRStack_48->reduce_byte_limit < 1) {
              local_fc = 0x7fffffff;
            }
            else {
              local_fc = pRStack_48->reduce_byte_limit / 8;
            }
            if (local_f4 < local_fc) {
              local_100 = local_f4;
            }
            else {
              if (pRStack_48->reduce_byte_limit < 1) {
                local_104 = 0x7fffffff;
              }
              else {
                local_104 = pRStack_48->reduce_byte_limit / 8;
              }
              local_100 = local_104;
            }
            local_xyzm._4_4_ = local_100;
            if (local_100 < 0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x118,"ref_gather_node_tec_block","malloc local_xyzm of REF_DBL negative");
              ref_node_local._4_4_ = 1;
            }
            else {
              xyzm = (REF_DBL *)malloc((long)local_100 << 3);
              if (xyzm == (REF_DBL *)0x0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0x118,"ref_gather_node_tec_block","malloc local_xyzm of REF_DBL NULL");
                ref_node_local._4_4_ = 2;
              }
              else if (local_xyzm._4_4_ < 0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0x119,"ref_gather_node_tec_block","malloc xyzm of REF_DBL negative");
                ref_node_local._4_4_ = 1;
              }
              else {
                nnode_written = (REF_GLOB)malloc((long)local_xyzm._4_4_ << 3);
                if ((void *)nnode_written == (void *)0x0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0x119,"ref_gather_node_tec_block","malloc xyzm of REF_DBL NULL");
                  ref_node_local._4_4_ = 2;
                }
                else {
                  for (local_88 = 0; local_88 < scalar_local._4_4_ + 3; local_88 = local_88 + 1) {
                    first = 0;
                    while (first < (long)l2c_local) {
                      global = first;
                      if ((long)local_xyzm._4_4_ < (long)l2c_local - first) {
                        local_110 = local_xyzm._4_4_;
                      }
                      else {
                        local_110 = (int)l2c_local - (int)first;
                      }
                      ivar = local_110;
                      first = local_110 + first;
                      for (status = 0; status < local_xyzm._4_4_; status = status + 1) {
                        xyzm[status] = 0.0;
                      }
                      for (status = 0; status < ivar; status = status + 1) {
                        _n = global + status;
                        single_float = (float)ref_sort_search_glob
                                                        (sorted_cellnode._4_4_,
                                                         _ref_private_macro_code_rxs,_n,
                                                         (REF_INT *)&sorted_cellnode);
                        sorted_local._4_4_ = single_float;
                        if ((single_float != 0.0) && (single_float != 7.00649e-45)) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                 ,0x129,"ref_gather_node_tec_block",(ulong)(uint)single_float,
                                 "node local failed");
                          return (REF_STATUS)single_float;
                        }
                        if (single_float == 0.0) {
                          i = pack[(int)sorted_cellnode];
                          if (local_88 < 3) {
                            xyzm[status] = *(REF_DBL *)
                                            (*(long *)(nnode_local + 0x38) +
                                            (long)(local_88 + i * 0xf) * 8);
                          }
                          else {
                            xyzm[status] = pRStack_38[local_88 + -3 + scalar_local._4_4_ * i];
                          }
                        }
                      }
                      ref_private_status_reis_ai._4_4_ =
                           ref_mpi_sum(pRStack_48,xyzm,(void *)nnode_written,ivar,3);
                      if (ref_private_status_reis_ai._4_4_ != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                               ,0x134,"ref_gather_node_tec_block",
                               (ulong)ref_private_status_reis_ai._4_4_,"sum");
                        return ref_private_status_reis_ai._4_4_;
                      }
                      if (pRStack_48->id == 0) {
                        if (ref_mpi._4_4_ == 1) {
                          for (status = 0; status < ivar; status = status + 1) {
                            ref_private_status_reis_ai._0_4_ =
                                 (float)*(double *)(nnode_written + (long)status * 8);
                            sVar1 = fwrite(&ref_private_status_reis_ai,4,1,(FILE *)file);
                            if (sVar1 != 1) {
                              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                     ,0x13d,"ref_gather_node_tec_block","single float",1,sVar1);
                              return 1;
                            }
                          }
                        }
                        else {
                          if (ref_mpi._4_4_ != 2) {
                            return 6;
                          }
                          sVar1 = (size_t)ivar;
                          sVar2 = fwrite((void *)nnode_written,8,(long)ivar,(FILE *)file);
                          if (sVar1 != sVar2) {
                            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                   ,0x142,"ref_gather_node_tec_block","block chunk",sVar1,sVar2);
                            return 1;
                          }
                        }
                      }
                    }
                    if (l2c_local != (REF_GLOB *)first) {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                             ,0x149,"ref_gather_node_tec_block","node miscount",l2c_local,first);
                      return 1;
                    }
                  }
                  if (nnode_written != 0) {
                    free((void *)nnode_written);
                  }
                  if (xyzm != (REF_DBL *)0x0) {
                    free(xyzm);
                  }
                  if (_ref_private_macro_code_rxs != (REF_GLOB *)0x0) {
                    free(_ref_private_macro_code_rxs);
                  }
                  if (pack != (REF_INT *)0x0) {
                    free(pack);
                  }
                  ref_node_local._4_4_ = 0;
                }
              }
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x10c,"ref_gather_node_tec_block",(ulong)(uint)ref_private_macro_code_rss_1,
                   "sort");
            ref_node_local._4_4_ = ref_private_macro_code_rss_1;
          }
        }
      }
    }
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_node_tec_block(
    REF_NODE ref_node, REF_GLOB nnode, REF_GLOB *l2c, REF_INT ldim,
    REF_DBL *scalar, int dataformat, FILE *file) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT chunk;
  REF_DBL *local_xyzm, *xyzm;
  REF_GLOB nnode_written, first, global;
  REF_INT local, n, i, ivar;
  REF_STATUS status;
  REF_INT *sorted_local, *pack, total_cellnode, position;
  REF_GLOB *sorted_cellnode;

  total_cellnode = 0;
  for (i = 0; i < ref_node_max(ref_node); i++) {
    if (REF_EMPTY != l2c[i] && ref_node_owned(ref_node, i)) {
      total_cellnode++;
    }
  }

  ref_malloc(sorted_local, total_cellnode, REF_INT);
  ref_malloc(sorted_cellnode, total_cellnode, REF_GLOB);
  ref_malloc(pack, total_cellnode, REF_INT);

  total_cellnode = 0;
  for (i = 0; i < ref_node_max(ref_node); i++) {
    if (REF_EMPTY != l2c[i] && ref_node_owned(ref_node, i)) {
      sorted_cellnode[total_cellnode] = l2c[i];
      pack[total_cellnode] = i;
      total_cellnode++;
    }
  }
  RSS(ref_sort_heap_glob(total_cellnode, sorted_cellnode, sorted_local),
      "sort");
  for (i = 0; i < total_cellnode; i++) {
    sorted_local[i] = pack[sorted_local[i]];
    sorted_cellnode[i] = l2c[sorted_local[i]];
  }
  ref_free(pack);

  chunk = (REF_INT)(nnode / ref_mpi_n(ref_mpi) + 1);
  chunk = MAX(chunk, 100000);
  chunk =
      MIN(chunk, ref_mpi_reduce_chunk_limit(ref_mpi, (REF_INT)sizeof(REF_DBL)));

  ref_malloc(local_xyzm, chunk, REF_DBL);
  ref_malloc(xyzm, chunk, REF_DBL);

  for (ivar = 0; ivar < 3 + ldim; ivar++) {
    nnode_written = 0;
    while (nnode_written < nnode) {
      first = nnode_written;
      n = (REF_INT)MIN((REF_GLOB)chunk, nnode - nnode_written);

      nnode_written += n;

      for (i = 0; i < chunk; i++) local_xyzm[i] = 0.0;

      for (i = 0; i < n; i++) {
        global = first + i;
        status = ref_sort_search_glob(total_cellnode, sorted_cellnode, global,
                                      &position);
        RXS(status, REF_NOT_FOUND, "node local failed");
        if (REF_SUCCESS == status) {
          local = sorted_local[position];
          if (ivar < 3) {
            local_xyzm[i] = ref_node_xyz(ref_node, ivar, local);
          } else {
            local_xyzm[i] = scalar[(ivar - 3) + ldim * local];
          }
        }
      }

      RSS(ref_mpi_sum(ref_mpi, local_xyzm, xyzm, n, REF_DBL_TYPE), "sum");

      if (ref_mpi_once(ref_mpi)) {
        switch (dataformat) {
          case 1:
            for (i = 0; i < n; i++) {
              float single_float;
              single_float = (float)xyzm[i];
              REIS(1, fwrite(&single_float, sizeof(float), 1, file),
                   "single float");
            }
            break;
          case 2:
            REIS(n, fwrite(xyzm, sizeof(double), (unsigned long)n, file),
                 "block chunk");
            break;
          default:
            return REF_IMPLEMENT;
        }
      }
    }
    REIS(nnode, nnode_written, "node miscount");
  }

  ref_free(xyzm);
  ref_free(local_xyzm);
  ref_free(sorted_cellnode);
  ref_free(sorted_local);

  return REF_SUCCESS;
}